

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

void Curl_setup_transfer(Curl_easy *data,int sockindex,curl_off_t size,_Bool getheader,
                        int writesockindex)

{
  int *piVar1;
  connectdata *pcVar2;
  HTTP *pHVar3;
  ushort uVar4;
  curl_socket_t cVar5;
  int iVar6;
  curl_socket_t cVar7;
  bool bVar8;
  curltime cVar9;
  
  pcVar2 = data->conn;
  pHVar3 = (data->req).p.http;
  if ((pcVar2->handler->protocol & 3) == 0) {
    bVar8 = false;
  }
  else {
    bVar8 = pHVar3->sending == HTTPSEND_REQUEST;
  }
  if ((((pcVar2->bits).field_0x7 & 2) != 0) || (pcVar2->httpversion == '\x14' || bVar8)) {
    iVar6 = sockindex;
    if ((sockindex == -1) && (iVar6 = writesockindex, writesockindex == -1)) {
      cVar7 = -1;
    }
    else {
      cVar7 = pcVar2->sock[iVar6];
    }
    pcVar2->sockfd = cVar7;
    pcVar2->writesockfd = cVar7;
    if (bVar8) {
      writesockindex = 0;
    }
  }
  else {
    cVar5 = -1;
    cVar7 = -1;
    if (sockindex != -1) {
      cVar7 = pcVar2->sock[sockindex];
    }
    pcVar2->sockfd = cVar7;
    if (writesockindex != -1) {
      cVar5 = pcVar2->sock[writesockindex];
    }
    pcVar2->writesockfd = cVar5;
  }
  uVar4 = (ushort)*(undefined4 *)&(data->req).field_0xd8;
  *(ushort *)&(data->req).field_0xd8 = uVar4 & 0xff7f | (ushort)getheader << 7;
  (data->req).size = size;
  if ((getheader) ||
     (((*(ushort *)&(data->req).field_0xd8 = uVar4 & 0xff7e | (ushort)getheader << 7, 0 < size &&
       (Curl_pgrsSetDownloadSize(data,size), ((data->req).field_0xd8 & 0x80) != 0)) ||
      (((data->set).field_0x9a3 & 0x10) == 0)))) {
    if (sockindex != -1) {
      piVar1 = &(data->req).keepon;
      *(byte *)piVar1 = (byte)*piVar1 | 1;
    }
    if (writesockindex != -1) {
      if (((data->state).field_0x661 & 1) != 0) {
        if (((pcVar2->handler->protocol & 3) != 0) && (pHVar3->sending == HTTPSEND_BODY)) {
          (data->req).exp100 = EXP100_AWAITING_CONTINUE;
          cVar9 = Curl_now();
          (data->req).start100.tv_sec = cVar9.tv_sec;
          (data->req).start100.tv_usec = cVar9.tv_usec;
          Curl_expire(data,(data->set).expect_100_timeout,EXPIRE_100_TIMEOUT);
          return;
        }
        (data->req).exp100 = EXP100_SENDING_REQUEST;
      }
      piVar1 = &(data->req).keepon;
      *(byte *)piVar1 = (byte)*piVar1 | 2;
    }
  }
  return;
}

Assistant:

void
Curl_setup_transfer(
  struct Curl_easy *data,   /* transfer */
  int sockindex,            /* socket index to read from or -1 */
  curl_off_t size,          /* -1 if unknown at this point */
  bool getheader,           /* TRUE if header parsing is wanted */
  int writesockindex        /* socket index to write to, it may very well be
                               the same we read from. -1 disables */
  )
{
  struct SingleRequest *k = &data->req;
  struct connectdata *conn = data->conn;
  struct HTTP *http = data->req.p.http;
  bool httpsending = ((conn->handler->protocol&PROTO_FAMILY_HTTP) &&
                      (http->sending == HTTPSEND_REQUEST));
  DEBUGASSERT(conn != NULL);
  DEBUGASSERT((sockindex <= 1) && (sockindex >= -1));

  if(conn->bits.multiplex || conn->httpversion == 20 || httpsending) {
    /* when multiplexing, the read/write sockets need to be the same! */
    conn->sockfd = sockindex == -1 ?
      ((writesockindex == -1 ? CURL_SOCKET_BAD : conn->sock[writesockindex])) :
      conn->sock[sockindex];
    conn->writesockfd = conn->sockfd;
    if(httpsending)
      /* special and very HTTP-specific */
      writesockindex = FIRSTSOCKET;
  }
  else {
    conn->sockfd = sockindex == -1 ?
      CURL_SOCKET_BAD : conn->sock[sockindex];
    conn->writesockfd = writesockindex == -1 ?
      CURL_SOCKET_BAD:conn->sock[writesockindex];
  }
  k->getheader = getheader;

  k->size = size;

  /* The code sequence below is placed in this function just because all
     necessary input is not always known in do_complete() as this function may
     be called after that */

  if(!k->getheader) {
    k->header = FALSE;
    if(size > 0)
      Curl_pgrsSetDownloadSize(data, size);
  }
  /* we want header and/or body, if neither then don't do this! */
  if(k->getheader || !data->set.opt_no_body) {

    if(sockindex != -1)
      k->keepon |= KEEP_RECV;

    if(writesockindex != -1) {
      /* HTTP 1.1 magic:

         Even if we require a 100-return code before uploading data, we might
         need to write data before that since the REQUEST may not have been
         finished sent off just yet.

         Thus, we must check if the request has been sent before we set the
         state info where we wait for the 100-return code
      */
      if((data->state.expect100header) &&
         (conn->handler->protocol&PROTO_FAMILY_HTTP) &&
         (http->sending == HTTPSEND_BODY)) {
        /* wait with write until we either got 100-continue or a timeout */
        k->exp100 = EXP100_AWAITING_CONTINUE;
        k->start100 = Curl_now();

        /* Set a timeout for the multi interface. Add the inaccuracy margin so
           that we don't fire slightly too early and get denied to run. */
        Curl_expire(data, data->set.expect_100_timeout, EXPIRE_100_TIMEOUT);
      }
      else {
        if(data->state.expect100header)
          /* when we've sent off the rest of the headers, we must await a
             100-continue but first finish sending the request */
          k->exp100 = EXP100_SENDING_REQUEST;

        /* enable the write bit when we're not waiting for continue */
        k->keepon |= KEEP_SEND;
      }
    } /* if(writesockindex != -1) */
  } /* if(k->getheader || !data->set.opt_no_body) */

}